

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<unsigned_char,unsigned_char,unsigned_char,duckdb::BinaryZeroIsNullWrapper,duckdb::ModuloOperator,bool,true,false>
               (uchar *ldata,uchar *rdata,uchar *result_data,idx_t count,ValidityMask *mask,bool fun
               )

{
  ulong uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ValidityMask *pVVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar9;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var10;
  uchar lentry;
  idx_t idx_in_entry;
  ulong uVar11;
  ulong uVar12;
  uchar *puVar13;
  uchar *puVar14;
  ulong uVar15;
  idx_t idx_in_entry_1;
  ulong uVar16;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  uchar *local_90;
  buffer_ptr<ValidityBuffer> *local_88;
  _Head_base<0UL,_unsigned_long_*,_false> local_80;
  ValidityMask *local_78;
  uchar *local_70;
  byte *local_68;
  ulong local_60;
  buffer_ptr<ValidityBuffer> *local_58;
  idx_t local_50;
  uchar *local_48;
  uchar *local_40;
  ulong local_38;
  
  _Var10._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_70 = rdata;
  local_68 = ldata;
  if (_Var10._M_head_impl == (unsigned_long *)0x0) {
    if (count != 0) {
      bVar9 = *ldata;
      local_88 = &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
      _Var10._M_head_impl = (unsigned_long *)0x0;
      uVar11 = 0;
      do {
        if (rdata[uVar11] == 0) {
          if (_Var10._M_head_impl == (unsigned_long *)0x0) {
            local_80._M_head_impl =
                 (unsigned_long *)(mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,(unsigned_long *)&local_80);
            p_Var4 = p_Stack_a0;
            peVar3 = local_a8;
            local_a8 = (element_type *)0x0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar3;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var4;
            if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
               p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (local_88);
            _Var10._M_head_impl =
                 (pTVar8->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var10._M_head_impl;
            rdata = local_70;
          }
          bVar7 = (byte)uVar11 & 0x3f;
          _Var10._M_head_impl[uVar11 >> 6] =
               _Var10._M_head_impl[uVar11 >> 6] &
               (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
          bVar7 = bVar9;
        }
        else {
          bVar7 = bVar9 % rdata[uVar11];
        }
        result_data[uVar11] = bVar7;
        uVar11 = uVar11 + 1;
      } while (count != uVar11);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_60 = count + 0x3f >> 6;
    local_58 = &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar11 = 0;
    local_88 = (buffer_ptr<ValidityBuffer> *)0x0;
    local_90 = result_data;
    local_78 = mask;
    local_50 = count;
    do {
      if (_Var10._M_head_impl == (unsigned_long *)0x0) {
        uVar16 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar16 = count;
        }
LAB_010d6e5e:
        uVar6 = uVar11;
        if (uVar11 < uVar16) {
          bVar9 = *local_68;
          do {
            if (rdata[uVar11] == 0) {
              if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                local_80._M_head_impl =
                     (unsigned_long *)(mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_a8,(unsigned_long *)&local_80);
                p_Var4 = p_Stack_a0;
                peVar3 = local_a8;
                local_a8 = (element_type *)0x0;
                p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar3;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var4;
                if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                   p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
                }
                pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                   (local_58);
                _Var10._M_head_impl =
                     (pTVar8->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                     _Var10._M_head_impl;
                rdata = local_70;
              }
              bVar7 = (byte)uVar11 & 0x3f;
              _Var10._M_head_impl[uVar11 >> 6] =
                   _Var10._M_head_impl[uVar11 >> 6] &
                   (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
              bVar7 = bVar9;
            }
            else {
              bVar7 = bVar9 % rdata[uVar11];
            }
            result_data[uVar11] = bVar7;
            uVar11 = uVar11 + 1;
            uVar6 = uVar16;
          } while (uVar16 != uVar11);
        }
      }
      else {
        uVar1 = _Var10._M_head_impl[(long)local_88];
        uVar16 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar16 = count;
        }
        uVar6 = uVar16;
        result_data = local_90;
        if (uVar1 != 0) {
          if (uVar1 == 0xffffffffffffffff) goto LAB_010d6e5e;
          uVar12 = uVar16 - uVar11;
          uVar6 = uVar11;
          if (uVar11 <= uVar16 && uVar12 != 0) {
            puVar13 = local_90 + uVar11;
            puVar14 = rdata + uVar11;
            uVar15 = 0;
            local_48 = puVar14;
            local_40 = puVar13;
            local_38 = uVar12;
            do {
              pVVar5 = local_78;
              if ((uVar1 >> (uVar15 & 0x3f) & 1) != 0) {
                bVar9 = *local_68;
                if (puVar14[uVar15] == 0) {
                  if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                    local_80._M_head_impl =
                         (unsigned_long *)
                         (local_78->super_TemplatedValidityMask<unsigned_long>).capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_a8,(unsigned_long *)&local_80);
                    p_Var4 = p_Stack_a0;
                    peVar3 = local_a8;
                    local_a8 = (element_type *)0x0;
                    p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var2 = (pVVar5->super_TemplatedValidityMask<unsigned_long>).validity_data.
                             internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (pVVar5->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = peVar3;
                    (pVVar5->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = p_Var4;
                    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                       (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                       p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
                    }
                    pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                             operator->(local_58);
                    _Var10._M_head_impl =
                         (pTVar8->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (local_78->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         _Var10._M_head_impl;
                    rdata = local_70;
                    uVar12 = local_38;
                    puVar13 = local_40;
                    puVar14 = local_48;
                    count = local_50;
                  }
                  bVar7 = (byte)(uVar15 + uVar11) & 0x3f;
                  _Var10._M_head_impl[uVar15 + uVar11 >> 6] =
                       _Var10._M_head_impl[uVar15 + uVar11 >> 6] &
                       (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
                }
                else {
                  bVar9 = bVar9 % puVar14[uVar15];
                }
                puVar13[uVar15] = bVar9;
              }
              uVar15 = uVar15 + 1;
              mask = local_78;
              uVar6 = uVar16;
              result_data = local_90;
            } while (uVar12 != uVar15);
          }
        }
      }
      uVar11 = uVar6;
      local_88 = (buffer_ptr<ValidityBuffer> *)((long)local_88 + 1);
    } while (local_88 != (buffer_ptr<ValidityBuffer> *)local_60);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}